

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void __thiscall pbrt::StatsAccumulator::WritePixelImages(StatsAccumulator *this)

{
  int iVar1;
  Stats *pSVar2;
  pointer pIVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  optional<float> *poVar7;
  undefined8 *puVar8;
  ulong uVar9;
  long lVar10;
  optional<float> oVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  optional<float> oVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  Image *pIVar17;
  ulong uVar18;
  Float FVar19;
  uint uVar20;
  undefined1 auVar21 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string local_198;
  ulong local_178;
  long *local_170 [2];
  long local_160 [2];
  ulong local_150;
  undefined1 local_148 [72];
  ulong uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined1 auStack_c0 [8];
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_b8;
  ulong uStack_a8;
  undefined1 auStack_a0 [8];
  optional<int> oStack_98;
  optional<float> oStack_90;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_88;
  ulong uStack_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Stack_78;
  StatsAccumulator *local_48;
  long local_40;
  ulong local_38;
  
  pSVar2 = this->stats;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pixelStatsBaseName_abi_cxx11_,
             DAT_031a51a8 + pixelStatsBaseName_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_198);
  _Stack_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_78._M_impl.super__Rb_tree_header._M_header;
  local_88 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
              )0x0;
  uStack_80 = 0;
  _Stack_78._M_impl._0_8_ = 0;
  _Stack_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8 = 0;
  auStack_c0 = (undefined1  [8])0x0;
  aStack_b8._0_8_ = 0;
  aStack_b8._8_8_ = 0;
  uStack_a8 = 0;
  auStack_a0 = (undefined1  [8])0x0;
  oStack_98.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  oStack_98.set = false;
  oStack_98._5_3_ = 0;
  oStack_90.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  oStack_90.set = false;
  oStack_90._5_3_ = 0;
  local_148._64_8_ = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  local_148._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_148[4] = false;
  local_148._5_3_ = 0;
  local_148._8_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_148[0xc] = false;
  local_148._13_3_ = 0;
  local_148._16_8_ = 0;
  local_148._24_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_148[0x1c] = false;
  local_148._29_3_ = 0;
  local_148._32_8_ = 0;
  local_148._40_8_ = 0;
  local_148._48_8_ = 0;
  local_148._56_8_ = 0;
  _Stack_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_78._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_78._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar6 = Image::Write(&pSVar2->pixelTime,&local_198,(ImageMetadata *)local_148);
  if (!bVar6) {
    LogFatal<char_const(&)[57]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/stats.cpp"
               ,0x1c1,"Check failed: %s",
               (char (*) [57])"stats->pixelTime.Write(pixelStatsBaseName + \"-time.exr\")");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&_Stack_78);
  if (uStack_80._0_1_ == true) {
    uStack_80 = uStack_80 & 0xffffffffffffff00;
  }
  if (oStack_90.set == true) {
    oStack_90.set = false;
  }
  if (oStack_98.set == true) {
    oStack_98.set = false;
  }
  if ((bool)auStack_a0[4] == true) {
    auStack_a0[4] = 0;
  }
  if (uStack_a8._0_1_ == true) {
    uStack_a8 = uStack_a8 & 0xffffffffffffff00;
  }
  if ((bool)auStack_c0[4] == true) {
    auStack_c0[4] = 0;
  }
  if (uStack_100._0_1_ == true) {
    uStack_100 = uStack_100 & 0xffffffffffffff00;
  }
  if ((bool)local_148[4] == true) {
    local_148[4] = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  local_48 = this;
  if ((this->stats->pixelCounterImages).
      super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      (this->stats->pixelCounterImages).
      super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar18 = 0;
    do {
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_170,pixelStatsBaseName_abi_cxx11_,
                 DAT_031a51a8 + pixelStatsBaseName_abi_cxx11_);
      std::__cxx11::string::append((char *)local_170);
      poVar7 = (optional<float> *)
               std::__cxx11::string::_M_append
                         ((char *)local_170,
                          (ulong)(this->stats->pixelCounterNames).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_dataplus._M_p)
      ;
      oVar11 = (optional<float>)(poVar7 + 2);
      if (*poVar7 == oVar11) {
        local_148._16_8_ = *(undefined8 *)oVar11;
        local_148._24_8_ = poVar7[3];
        local_148._0_8_ = (long)local_148 + 0x10;
      }
      else {
        local_148._16_8_ = *(undefined8 *)oVar11;
        local_148._0_8_ = *poVar7;
      }
      local_148._8_8_ = poVar7[1];
      *poVar7 = oVar11;
      poVar7[1].optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      poVar7[1].set = false;
      *(undefined3 *)&poVar7[1].field_0x5 = 0;
      poVar7[2].optionalValue.__data[0] = '\0';
      puVar8 = (undefined8 *)std::__cxx11::string::append(local_148);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar12) {
        local_198.field_2 = *paVar12;
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      }
      else {
        local_198.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_198._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_198._M_string_length = puVar8[1];
      *puVar8 = paVar12;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      if (local_148._0_8_ != (long)local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      if (local_170[0] != local_160) {
        operator_delete(local_170[0],local_160[0] + 1);
      }
      if (local_198._M_string_length != 0) {
        uVar9 = 0;
        do {
          if (local_198._M_dataplus._M_p[uVar9] == '/') {
            local_198._M_dataplus._M_p[uVar9] = '_';
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < local_198._M_string_length);
      }
      pIVar3 = (this->stats->pixelCounterImages).
               super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_178 = uVar18 * 0x118;
      iVar1 = pIVar3[uVar18].resolution.super_Tuple2<pbrt::Point2,_int>.y;
      bVar6 = iVar1 < 1;
      local_150 = uVar18;
      if (0 < iVar1) {
        pIVar17 = pIVar3 + uVar18;
        lVar15 = 0;
        lVar14 = 0;
        do {
          if (0 < (pIVar17->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
            bVar4 = true;
            lVar16 = 0;
            do {
              FVar19 = Image::GetChannel(pIVar17,(Point2i)(lVar15 + lVar16),0,
                                         (WrapMode2D)0x200000002);
              if ((FVar19 != 0.0) || (NAN(FVar19))) {
                if (bVar4) goto LAB_004b842d;
                break;
              }
              lVar16 = lVar16 + 1;
              lVar10 = (long)(pIVar17->resolution).super_Tuple2<pbrt::Point2,_int>.x;
              bVar4 = lVar16 < lVar10;
            } while (lVar16 < lVar10);
          }
          lVar14 = lVar14 + 1;
          lVar16 = (long)(pIVar17->resolution).super_Tuple2<pbrt::Point2,_int>.y;
          lVar15 = lVar15 + 0x100000000;
          bVar6 = lVar16 <= lVar14;
        } while (lVar14 < lVar16);
      }
LAB_004b842d:
      this = local_48;
      uVar18 = local_150;
      if (!bVar6) {
        local_88 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                    )0x0;
        uStack_80 = 0;
        _Stack_78._M_impl._0_8_ = 0;
        _Stack_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        _Stack_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        _Stack_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_c8 = 0;
        auStack_c0 = (undefined1  [8])0x0;
        aStack_b8._0_8_ = 0;
        aStack_b8._8_8_ = 0;
        uStack_a8 = 0;
        auStack_a0 = (undefined1  [8])0x0;
        oStack_98.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
        oStack_98.set = false;
        oStack_98._5_3_ = 0;
        oStack_90.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        oStack_90.set = false;
        oStack_90._5_3_ = 0;
        local_148._64_8_ = 0;
        uStack_100 = 0;
        uStack_f8 = 0;
        uStack_f0 = 0;
        uStack_e8 = 0;
        uStack_e0 = 0;
        uStack_d8 = 0;
        uStack_d0 = 0;
        local_148._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        local_148[4] = false;
        local_148._5_3_ = 0;
        local_148._8_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        local_148[0xc] = false;
        local_148._13_3_ = 0;
        local_148._16_8_ = 0;
        local_148._24_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        local_148[0x1c] = false;
        local_148._29_3_ = 0;
        local_148._32_8_ = 0;
        local_148._40_8_ = 0;
        local_148._48_8_ = 0;
        local_148._56_8_ = 0;
        _Stack_78._M_impl.super__Rb_tree_header._M_header._M_left =
             &_Stack_78._M_impl.super__Rb_tree_header._M_header;
        _Stack_78._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_78._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_78._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar6 = Image::Write((Image *)((long)&((local_48->stats->pixelCounterImages).
                                               super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->format +
                                      local_178),&local_198,(ImageMetadata *)local_148);
        if (!bVar6) {
          LogFatal<char_const(&)[38]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/stats.cpp"
                     ,0x1d1,"Check failed: %s",
                     (char (*) [38])"stats->pixelCounterImages[i].Write(n)");
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&_Stack_78);
        if (uStack_80._0_1_ == true) {
          uStack_80 = uStack_80 & 0xffffffffffffff00;
        }
        if (oStack_90.set == true) {
          oStack_90.set = false;
        }
        if (oStack_98.set == true) {
          oStack_98.set = false;
        }
        if ((bool)auStack_a0[4] == true) {
          auStack_a0[4] = 0;
        }
        if (uStack_a8._0_1_ == true) {
          uStack_a8 = uStack_a8 & 0xffffffffffffff00;
        }
        if ((bool)auStack_c0[4] == true) {
          auStack_c0[4] = 0;
        }
        if (uStack_100._0_1_ == true) {
          uStack_100 = uStack_100 & 0xffffffffffffff00;
        }
        if ((bool)local_148[4] == true) {
          local_148[4] = 0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ulong)(((long)(this->stats->pixelCounterImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->stats->pixelCounterImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5075075075075075));
  }
  if ((this->stats->pixelRatioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->stats->pixelRatioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    oVar11 = (optional<float>)((long)local_148 + 0x10);
    uVar18 = 0;
    do {
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_170,pixelStatsBaseName_abi_cxx11_,
                 DAT_031a51a8 + pixelStatsBaseName_abi_cxx11_);
      std::__cxx11::string::append((char *)local_170);
      poVar7 = (optional<float> *)
               std::__cxx11::string::_M_append
                         ((char *)local_170,
                          (ulong)(this->stats->pixelRatioNames).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar18]._M_dataplus._M_p)
      ;
      oVar13 = (optional<float>)(poVar7 + 2);
      if (*poVar7 == oVar13) {
        local_148._16_8_ = *(undefined8 *)oVar13;
        local_148._24_8_ = poVar7[3];
        local_148._0_8_ = oVar11;
      }
      else {
        local_148._16_8_ = *(undefined8 *)oVar13;
        local_148._0_8_ = *poVar7;
      }
      local_148._8_8_ = poVar7[1];
      *poVar7 = oVar13;
      poVar7[1].optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      poVar7[1].set = false;
      *(undefined3 *)&poVar7[1].field_0x5 = 0;
      poVar7[2].optionalValue.__data[0] = '\0';
      puVar8 = (undefined8 *)std::__cxx11::string::append(local_148);
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar12) {
        local_198.field_2 = *paVar12;
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      }
      else {
        local_198.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_198._M_dataplus._M_p = (pointer)*puVar8;
      }
      local_198._M_string_length = puVar8[1];
      *puVar8 = paVar12;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      if ((optional<float>)local_148._0_8_ != oVar11) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      if (local_170[0] != local_160) {
        operator_delete(local_170[0],local_160[0] + 1);
      }
      if (local_198._M_string_length != 0) {
        uVar9 = 0;
        do {
          if (local_198._M_dataplus._M_p[uVar9] == '/') {
            local_198._M_dataplus._M_p[uVar9] = '_';
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < local_198._M_string_length);
      }
      pIVar3 = (this->stats->pixelRatioImages).
               super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_40 = uVar18 * 0x118;
      iVar1 = pIVar3[uVar18].resolution.super_Tuple2<pbrt::Point2,_int>.y;
      local_178 = CONCAT71((int7)((ulong)local_40 >> 8),iVar1 < 1);
      local_38 = uVar18;
      if (0 < iVar1) {
        pIVar17 = pIVar3 + uVar18;
        lVar14 = 0;
        local_178 = 0;
        do {
          if (0 < (pIVar17->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
            bVar6 = true;
            lVar15 = 0;
            do {
              Image::GetChannels((ImageChannelValues *)local_148,pIVar17,
                                 (Point2i)(lVar15 + (lVar14 << 0x20)),(WrapMode2D)0x200000002);
              oVar13 = (optional<float>)local_148._8_8_;
              if ((optional<float>)local_148._8_8_ == (optional<float>)0x0) {
                oVar13 = oVar11;
              }
              uVar20 = *(uint *)oVar13;
              auVar21 = ZEXT464(uVar20);
              if (1 < (ulong)local_148._40_8_) {
                uVar18 = 1;
                do {
                  auVar5 = vmaxss_avx(ZEXT416(*(uint *)((long)oVar13 + uVar18 * 4)),auVar21._0_16_);
                  auVar21 = ZEXT1664(auVar5);
                  uVar20 = auVar5._0_4_;
                  uVar18 = uVar18 + 1;
                } while (local_148._40_8_ != uVar18);
              }
              local_150 = CONCAT44(local_150._4_4_,uVar20);
              local_148._40_8_ = 0;
              (**(code **)(*(long *)local_148._0_8_ + 0x18))
                        (local_148._0_8_,local_148._8_8_,local_148._32_8_ << 2,4);
              if (((float)local_150 != 0.0) || (NAN((float)local_150))) {
                if (bVar6) goto LAB_004b8834;
                break;
              }
              lVar15 = lVar15 + 1;
              lVar16 = (long)(pIVar17->resolution).super_Tuple2<pbrt::Point2,_int>.x;
              bVar6 = lVar15 < lVar16;
            } while (lVar15 < lVar16);
          }
          lVar14 = lVar14 + 1;
          iVar1 = (pIVar17->resolution).super_Tuple2<pbrt::Point2,_int>.y;
          local_178 = CONCAT71((int7)(int3)((uint)iVar1 >> 8),iVar1 <= lVar14);
        } while (lVar14 < iVar1);
      }
LAB_004b8834:
      this = local_48;
      if ((local_178 & 1) == 0) {
        local_88 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                    )0x0;
        uStack_80 = 0;
        _Stack_78._M_impl._0_8_ = 0;
        _Stack_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        _Stack_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        _Stack_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_c8 = 0;
        auStack_c0 = (undefined1  [8])0x0;
        aStack_b8._0_8_ = 0;
        aStack_b8._8_8_ = 0;
        uStack_a8 = 0;
        auStack_a0 = (undefined1  [8])0x0;
        oStack_98.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
        oStack_98.set = false;
        oStack_98._5_3_ = 0;
        oStack_90.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        oStack_90.set = false;
        oStack_90._5_3_ = 0;
        local_148._64_8_ = 0;
        uStack_100 = 0;
        uStack_f8 = 0;
        uStack_f0 = 0;
        uStack_e8 = 0;
        uStack_e0 = 0;
        uStack_d8 = 0;
        uStack_d0 = 0;
        local_148._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        local_148[4] = false;
        local_148._5_3_ = 0;
        local_148._8_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        local_148[0xc] = false;
        local_148._13_3_ = 0;
        local_148._16_8_ = 0;
        local_148._24_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        local_148[0x1c] = false;
        local_148._29_3_ = 0;
        local_148._32_8_ = 0;
        local_148._40_8_ = 0;
        local_148._48_8_ = 0;
        local_148._56_8_ = 0;
        _Stack_78._M_impl.super__Rb_tree_header._M_header._M_left =
             &_Stack_78._M_impl.super__Rb_tree_header._M_header;
        _Stack_78._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_78._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_78._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar6 = Image::Write((Image *)((long)&((local_48->stats->pixelRatioImages).
                                               super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->format +
                                      local_40),&local_198,(ImageMetadata *)local_148);
        if (!bVar6) {
          LogFatal<char_const(&)[36]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/stats.cpp"
                     ,0x1e2,"Check failed: %s",(char (*) [36])"stats->pixelRatioImages[i].Write(n)")
          ;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&_Stack_78);
        if (uStack_80._0_1_ == true) {
          uStack_80 = uStack_80 & 0xffffffffffffff00;
        }
        if (oStack_90.set == true) {
          oStack_90.set = false;
        }
        if (oStack_98.set == true) {
          oStack_98.set = false;
        }
        if ((bool)auStack_a0[4] == true) {
          auStack_a0[4] = 0;
        }
        if (uStack_a8._0_1_ == true) {
          uStack_a8 = uStack_a8 & 0xffffffffffffff00;
        }
        if ((bool)auStack_c0[4] == true) {
          auStack_c0[4] = 0;
        }
        if (uStack_100._0_1_ == true) {
          uStack_100 = uStack_100 & 0xffffffffffffff00;
        }
        if ((bool)local_148[4] == true) {
          local_148[4] = 0;
        }
      }
      uVar18 = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (ulong)(((long)(this->stats->pixelRatioImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->stats->pixelRatioImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5075075075075075));
  }
  return;
}

Assistant:

void StatsAccumulator::WritePixelImages() const {
    // FIXME: do this where?
    CHECK(stats->pixelTime.Write(pixelStatsBaseName + "-time.exr"));

    for (size_t i = 0; i < stats->pixelCounterImages.size(); ++i) {
        std::string n = pixelStatsBaseName + "-" + stats->pixelCounterNames[i] + ".exr";
        for (size_t j = 0; j < n.size(); ++j)
            if (n[j] == '/')
                n[j] = '_';

        auto AllZero = [](const Image &im) {
            for (int y = 0; y < im.Resolution().y; ++y)
                for (int x = 0; x < im.Resolution().x; ++x)
                    if (im.GetChannel({x, y}, 0) != 0)
                        return false;
            return true;
        };
        if (!AllZero(stats->pixelCounterImages[i]))
            CHECK(stats->pixelCounterImages[i].Write(n));
    }

    for (size_t i = 0; i < stats->pixelRatioImages.size(); ++i) {
        std::string n = pixelStatsBaseName + "-" + stats->pixelRatioNames[i] + ".exr";
        for (size_t j = 0; j < n.size(); ++j)
            if (n[j] == '/')
                n[j] = '_';

        auto AllZero = [](const Image &im) {
            for (int y = 0; y < im.Resolution().y; ++y)
                for (int x = 0; x < im.Resolution().x; ++x)
                    if (im.GetChannels({x, y}).MaxValue() != 0)
                        return false;
            return true;
        };
        if (!AllZero(stats->pixelRatioImages[i]))
            CHECK(stats->pixelRatioImages[i].Write(n));
    }
}